

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randr.c
# Opt level: O3

natwm_error randr_get_screens(natwm_state *state,randr_monitor ***result,size_t *length)

{
  xcb_randr_crtc_t xVar1;
  xcb_rectangle_t xVar2;
  undefined4 uVar3;
  uint uVar4;
  randr_monitor **__ptr;
  randr_monitor **pprVar5;
  long lVar6;
  void *__ptr_00;
  void *__ptr_01;
  randr_monitor *prVar7;
  natwm_error nVar8;
  ulong uVar9;
  ulong uVar10;
  void *local_38;
  xcb_generic_error_t *err;
  
  local_38 = (void *)0x0;
  uVar3 = xcb_randr_get_screen_resources(state->xcb,state->screen->root);
  __ptr = (randr_monitor **)xcb_randr_get_screen_resources_reply(state->xcb,uVar3,&local_38);
  if ((local_38 == (void *)0x0) && (__ptr != (randr_monitor **)0x0)) {
    uVar4 = xcb_randr_get_screen_resources_outputs_length(__ptr);
    if ((int)uVar4 < 1) {
      __assert_fail("screen_count > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cfrank[P]natwm/src/core/randr.c"
                    ,0x2f,
                    "enum natwm_error randr_get_screens(const struct natwm_state *, struct randr_monitor ***, size_t *)"
                   );
    }
    uVar10 = (ulong)uVar4;
    pprVar5 = (randr_monitor **)calloc(uVar10,8);
    if (pprVar5 == (randr_monitor **)0x0) {
LAB_00108ceb:
      free(__ptr);
      nVar8 = MEMORY_ALLOCATION_ERROR;
    }
    else {
      lVar6 = xcb_randr_get_screen_resources_outputs(__ptr);
      uVar9 = 0;
      do {
        uVar3 = xcb_randr_get_output_info(state->xcb,*(undefined4 *)(lVar6 + uVar9 * 4),0);
        __ptr_00 = (void *)xcb_randr_get_output_info_reply(state->xcb,uVar3,&local_38);
        if ((local_38 == (void *)0x0) || (__ptr_00 != (void *)0x0)) {
          uVar3 = xcb_randr_get_crtc_info(state->xcb,*(undefined4 *)((long)__ptr_00 + 0xc),0);
          __ptr_01 = (void *)xcb_randr_get_crtc_info_reply(state->xcb,uVar3,&local_38);
          if ((local_38 == (void *)0x0) || (__ptr_01 != (void *)0x0)) {
            xVar2 = *(xcb_rectangle_t *)((long)__ptr_01 + 0xc);
            xVar1 = *(xcb_randr_crtc_t *)((long)__ptr_00 + 0xc);
            prVar7 = (randr_monitor *)malloc(0xc);
            if (prVar7 == (randr_monitor *)0x0) {
              __ptr = pprVar5;
              if (uVar9 != 0) {
                uVar10 = 0;
                do {
                  if (pprVar5[uVar10] != (randr_monitor *)0x0) {
                    free(pprVar5[uVar10]);
                  }
                  uVar10 = uVar10 + 1;
                } while (uVar9 != uVar10);
              }
              goto LAB_00108ceb;
            }
            prVar7->id = xVar1;
            prVar7->rect = xVar2;
            pprVar5[uVar9] = prVar7;
            free(__ptr_01);
            free(__ptr_00);
          }
          else {
            free(__ptr_00);
            free(local_38);
          }
        }
        else {
          internal_logger(natwm_logger,LEVEL_WARNING,"Failed to get info for a RANDR screen.");
          free(local_38);
        }
        uVar9 = uVar9 + 1;
      } while (uVar10 != uVar9);
      xcb_randr_select_input(state->xcb,state->screen->root,1);
      *result = pprVar5;
      *length = uVar10;
      free(__ptr);
      nVar8 = NO_ERROR;
    }
  }
  else {
    internal_logger(natwm_logger,LEVEL_ERROR,"Failed to get RANDR screens");
    nVar8 = GENERIC_ERROR;
    if (__ptr != (randr_monitor **)0x0) {
      free(__ptr);
    }
  }
  return nVar8;
}

Assistant:

enum natwm_error randr_get_screens(const struct natwm_state *state, struct randr_monitor ***result,
                                   size_t *length)
{
        xcb_generic_error_t *err = XCB_NONE;

        xcb_randr_get_screen_resources_cookie_t resources_cookie
                = xcb_randr_get_screen_resources(state->xcb, state->screen->root);
        xcb_randr_get_screen_resources_reply_t *resources_reply
                = xcb_randr_get_screen_resources_reply(state->xcb, resources_cookie, &err);

        if (err != XCB_NONE || resources_reply == NULL) {
                LOG_ERROR(natwm_logger, "Failed to get RANDR screens");

                if (resources_reply != NULL) {
                        free(resources_reply);
                }

                return GENERIC_ERROR;
        }

        int screen_count = xcb_randr_get_screen_resources_outputs_length(resources_reply);

        assert(screen_count > 0);

        struct randr_monitor **monitors
                = calloc((size_t)screen_count, sizeof(struct randr_monitor *));

        if (monitors == NULL) {
                free(resources_reply);

                return MEMORY_ALLOCATION_ERROR;
        }

        xcb_randr_output_t *outputs = xcb_randr_get_screen_resources_outputs(resources_reply);

        for (int i = 0; i < screen_count; ++i) {
                xcb_randr_get_output_info_cookie_t cookie
                        = xcb_randr_get_output_info(state->xcb, outputs[i], XCB_CURRENT_TIME);
                xcb_randr_get_output_info_reply_t *output_info_reply
                        = xcb_randr_get_output_info_reply(state->xcb, cookie, &err);

                if (err != XCB_NONE && output_info_reply == NULL) {
                        LOG_WARNING(natwm_logger, "Failed to get info for a RANDR screen.");

                        free(err);

                        continue;
                }

                xcb_randr_get_crtc_info_cookie_t crtc_info_cookie = xcb_randr_get_crtc_info(
                        state->xcb, output_info_reply->crtc, XCB_CURRENT_TIME);
                xcb_randr_get_crtc_info_reply_t *crtc_info_reply
                        = xcb_randr_get_crtc_info_reply(state->xcb, crtc_info_cookie, &err);

                if (err != XCB_NONE && crtc_info_reply == NULL) {
                        // We encounter this when we find an inactive RANDR
                        // screens
                        free(output_info_reply);
                        free(err);

                        continue;
                }

                xcb_rectangle_t screen_rect = {
                        .x = crtc_info_reply->x,
                        .y = crtc_info_reply->y,
                        .width = crtc_info_reply->width,
                        .height = crtc_info_reply->height,
                };

                struct randr_monitor *monitor
                        = randr_monitor_create(output_info_reply->crtc, screen_rect);

                if (monitor == NULL) {
                        // Mem error, need to free existing monitors
                        for (int j = 0; j < i; ++j) {
                                if (monitors[j] != NULL) {
                                        randr_monitor_destroy(monitors[j]);
                                }
                        }

                        free(monitors);

                        return MEMORY_ALLOCATION_ERROR;
                }

                monitors[i] = monitor;

                free(crtc_info_reply);
                free(output_info_reply);
        }

        // Listen for events
        xcb_randr_select_input(
                state->xcb, state->screen->root, XCB_RANDR_NOTIFY_MASK_SCREEN_CHANGE);

        *result = monitors;
        *length = (size_t)screen_count;

        free(resources_reply);

        return NO_ERROR;
}